

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

bool __thiscall
cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix,bool recursive)

{
  string *psVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Status SVar6;
  unsigned_long uVar7;
  char *__s1;
  undefined8 uVar8;
  unsigned_long dindex;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  Directory d;
  string next;
  allocator<char> local_f9;
  Directory local_f8;
  string local_f0;
  cmArchiveWrite *local_d0;
  size_t local_c8;
  char *local_c0;
  string local_b8;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  iVar5 = strcmp(path,".");
  if (iVar5 == 0) {
    iVar5 = std::__cxx11::string::compare((char *)&this->Format);
    if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&this->Format), iVar5 == 0))
    goto LAB_00120da1;
  }
  bVar3 = AddFile(this,path,skip,prefix);
  if (!bVar3) {
    return false;
  }
LAB_00120da1:
  local_d0 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,path,(allocator<char> *)&local_60);
  bVar4 = cmsys::SystemTools::FileIsDirectory(&local_b8);
  bVar3 = true;
  if (bVar4 && recursive) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,path,&local_f9);
    bVar3 = cmsys::SystemTools::FileIsSymlink(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1));
  }
  bVar4 = true;
  if (bVar3 == false) {
    cmsys::Directory::Directory(&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,path,(allocator<char> *)&local_60);
    SVar6 = cmsys::Directory::Load(&local_f8,&local_b8,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    bVar4 = true;
    if (SVar6.Kind_ == Success) {
      local_60.first._M_len = strlen(path);
      local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_b8.field_2._M_allocated_capacity = (long)&local_b8.field_2 + 8;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 1;
      local_b8.field_2._M_local_buf[8] = '/';
      local_48 = 1;
      local_38 = 0;
      views._M_len = 2;
      views._M_array = &local_60;
      local_60.first._M_str = path;
      local_40 = (undefined1 *)local_b8.field_2._M_allocated_capacity;
      cmCatViews(&local_f0,views);
      local_c8 = skip;
      local_c0 = prefix;
      iVar5 = std::__cxx11::string::compare((char *)&local_f0);
      if (iVar5 == 0) {
        psVar1 = &local_d0->Format;
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 == 0)) {
          local_f0._M_string_length = 0;
          *local_f0._M_dataplus._M_p = '\0';
        }
      }
      sVar2 = local_f0._M_string_length;
      uVar7 = cmsys::Directory::GetNumberOfFiles(&local_f8);
      if (uVar7 != 0) {
        dindex = 0;
        do {
          __s1 = cmsys::Directory::GetFile(&local_f8,dindex);
          iVar5 = strcmp(__s1,".");
          if ((iVar5 != 0) && (iVar5 = strcmp(__s1,".."), iVar5 != 0)) {
            if (local_f0._M_string_length < sVar2) {
              uVar8 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",sVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              cmsys::Directory::~Directory(&local_f8);
              _Unwind_Resume(uVar8);
            }
            local_f0._M_dataplus._M_p[sVar2] = '\0';
            local_f0._M_string_length = sVar2;
            std::__cxx11::string::append((char *)&local_f0);
            bVar3 = AddPath(local_d0,local_f0._M_dataplus._M_p,local_c8,local_c0,true);
            if (!bVar3) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar4 = false;
              goto LAB_00121030;
            }
          }
          dindex = dindex + 1;
        } while (uVar7 != dindex);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
LAB_00121030:
    cmsys::Directory::~Directory(&local_f8);
  }
  return bVar4;
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path, size_t skip, const char* prefix,
                             bool recursive)
{
  if (strcmp(path, ".") != 0 ||
      (this->Format != "zip" && this->Format != "7zip")) {
    if (!this->AddFile(path, skip, prefix)) {
      return false;
    }
  }
  if ((!cmSystemTools::FileIsDirectory(path) || !recursive) ||
      cmSystemTools::FileIsSymlink(path)) {
    return true;
  }
  cmsys::Directory d;
  if (d.Load(path)) {
    std::string next = cmStrCat(path, '/');
    if (next == "./" && (this->Format == "zip" || this->Format == "7zip")) {
      next.clear();
    }
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for (unsigned long i = 0; i < n; ++i) {
      const char* file = d.GetFile(i);
      if (strcmp(file, ".") != 0 && strcmp(file, "..") != 0) {
        next.erase(end);
        next += file;
        if (!this->AddPath(next.c_str(), skip, prefix)) {
          return false;
        }
      }
    }
  }
  return true;
}